

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter anon_unknown.dwarf_88686::findOrCreateFederateFilter(HelicsFederate fed,Filter *filter)

{
  Filter *pFVar1;
  bool bVar2;
  pointer pFVar3;
  Filter *in_RSI;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *in_RDI;
  __single_object filt;
  HelicsFilter hfilt;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  ind;
  InterfaceHandle handle;
  FedObject *fedObj;
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  *in_stack_ffffffffffffff30;
  shared_ptr<helics::Federate> *this;
  HelicsError *in_stack_ffffffffffffff40;
  HelicsFederate in_stack_ffffffffffffff48;
  bool local_91;
  shared_ptr<helics::Federate> local_88;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
  *in_stack_ffffffffffffff88;
  HelicsFederate in_stack_ffffffffffffff90;
  InterfaceHandle local_54;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_50;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_40;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_38;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  local_30;
  InterfaceHandle local_24 [3];
  Filter *local_18;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_10;
  pointer local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24[0] = helics::Interface::getHandle(&in_RSI->super_Interface);
  local_38 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
             std::
             vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
             ::begin(in_stack_ffffffffffffff28);
  local_40 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
             std::
             vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
             ::end(in_stack_ffffffffffffff28);
  local_30 = std::
             upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>*,std::vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                       (local_38,local_40,local_24);
  local_50 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
             std::
             vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
             ::end(in_stack_ffffffffffffff28);
  bVar2 = __gnu_cxx::
          operator==<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
                    (in_stack_ffffffffffffff30,
                     (__normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
                      *)in_stack_ffffffffffffff28);
  local_91 = false;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
    ::operator*(&local_30);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e6d20);
    local_54 = helics::Interface::getHandle(&pFVar3->filtPtr->super_Interface);
    local_91 = helics::InterfaceHandle::operator==(&local_54,local_24[0]);
  }
  if (local_91 == false) {
    std::make_unique<helics::FilterObject>();
    pFVar1 = local_18;
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e6db2);
    pFVar3->filtPtr = pFVar1;
    bVar2 = helics::Filter::isCloningFilter(local_18);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e6dd8);
    pFVar3->cloning = bVar2;
    getFedSharedPtr(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e6e08);
    this = &local_88;
    std::shared_ptr<helics::Federate>::operator=
              (this,(shared_ptr<helics::Federate> *)in_stack_ffffffffffffff28);
    std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1e6e28);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)this,
               (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               in_stack_ffffffffffffff28);
    local_8 = (pointer)federateAddFilter(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (local_10);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (local_10);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
    ::operator->(&local_30);
    local_8 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::get
                        ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                          *)in_stack_ffffffffffffff30);
  }
  return local_8;
}

Assistant:

HelicsFilter findOrCreateFederateFilter(HelicsFederate fed, helics::Filter& filter)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = filter.getHandle();
    auto ind = std::upper_bound(fedObj->filters.begin(), fedObj->filters.end(), handle, filterSearch);
    if (ind != fedObj->filters.end() && (*ind)->filtPtr->getHandle() == handle) {
        HelicsFilter hfilt = ind->get();
        return hfilt;
    }

    auto filt = std::make_unique<helics::FilterObject>();
    filt->filtPtr = &filter;
    filt->cloning = filter.isCloningFilter();
    filt->fedptr = getFedSharedPtr(fed, nullptr);
    return federateAddFilter(fed, std::move(filt));
}